

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement.cpp
# Opt level: O1

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::PreparedStatement::PendingQuery
          (PreparedStatement *this,case_insensitive_map_t<BoundParameterData> *named_values,
          bool allow_stream_result)

{
  PreparedStatementData *pPVar1;
  ClientContext *query;
  char in_CL;
  undefined7 in_register_00000011;
  PendingQueryParameters parameters;
  InvalidInputException local_b0;
  undefined1 local_a0 [128];
  
  local_b0.super_Exception._0_8_ = CONCAT71(in_register_00000011,allow_stream_result);
  if ((char)named_values[1]._M_h._M_bucket_count == '\0') {
    local_a0._0_8_ = local_a0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a0,"Attempting to execute an unsuccessfully prepared statement!","");
    InvalidInputException::InvalidInputException(&local_b0,(string *)local_a0);
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_);
    }
    ErrorData::ErrorData((ErrorData *)local_a0,(exception *)&local_b0);
    make_uniq<duckdb::PendingQueryResult,duckdb::ErrorData>((duckdb *)this,(ErrorData *)local_a0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_a0 + 0x48));
    if ((undefined1 *)local_a0._40_8_ != local_a0 + 0x38) {
      operator_delete((void *)local_a0._40_8_);
    }
    if ((undefined1 *)local_a0._8_8_ != local_a0 + 0x18) {
      operator_delete((void *)local_a0._8_8_);
    }
    ::std::runtime_error::~runtime_error((runtime_error *)&local_b0);
  }
  else {
    local_b0.super_Exception._8_1_ = 0;
    VerifyParameters<duckdb::BoundParameterData>
              ((case_insensitive_map_t<duckdb::BoundParameterData> *)local_b0.super_Exception._0_8_,
               (case_insensitive_map_t<idx_t> *)&named_values[3]._M_h._M_rehash_policy);
    if (in_CL == '\0') {
      local_b0.super_Exception._8_1_ = 0;
    }
    else {
      pPVar1 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                         ((shared_ptr<duckdb::PreparedStatementData,_true> *)
                          &(named_values->_M_h)._M_before_begin);
      local_b0.super_Exception._8_1_ = (pPVar1->properties).allow_stream_result;
    }
    query = shared_ptr<duckdb::ClientContext,_true>::operator->
                      ((shared_ptr<duckdb::ClientContext,_true> *)named_values);
    ClientContext::PendingQuery
              ((ClientContext *)this,(string *)query,
               (shared_ptr<duckdb::PreparedStatementData,_true> *)
               &(named_values->_M_h)._M_rehash_policy,
               (PendingQueryParameters *)&(named_values->_M_h)._M_before_begin);
  }
  return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         this;
}

Assistant:

unique_ptr<PendingQueryResult> PreparedStatement::PendingQuery(case_insensitive_map_t<BoundParameterData> &named_values,
                                                               bool allow_stream_result) {
	if (!success) {
		auto exception = InvalidInputException("Attempting to execute an unsuccessfully prepared statement!");
		return make_uniq<PendingQueryResult>(ErrorData(exception));
	}
	PendingQueryParameters parameters;
	parameters.parameters = &named_values;

	try {
		VerifyParameters(named_values, named_param_map);
	} catch (const std::exception &ex) {
		return make_uniq<PendingQueryResult>(ErrorData(ex));
	}

	D_ASSERT(data);
	parameters.allow_stream_result = allow_stream_result && data->properties.allow_stream_result;
	auto result = context->PendingQuery(query, data, parameters);
	// The result should not contain any reference to the 'vector<Value> parameters.parameters'
	return result;
}